

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_float(float value)

{
  AMQP_VALUE_DATA *pAVar1;
  LOGGER_LOG p_Var2;
  
  pAVar1 = REFCOUNT_AMQP_VALUE_DATA_Create();
  if (pAVar1 == (AMQP_VALUE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_float",0x2bf,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar1->type = AMQP_TYPE_FLOAT;
    (pAVar1->value).float_value = value;
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE amqpvalue_create_float(float value)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_081: [If allocating the AMQP_VALUE fails then amqpvalue_create_float shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_080: [amqpvalue_create_float shall return a handle to an AMQP_VALUE that stores a float value.] */
        result->type = AMQP_TYPE_FLOAT;
        result->value.float_value = value;
    }

    return result;
}